

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O0

void __thiscall StackTrace::pop_stack_element(StackTrace *this)

{
  unsigned_long uVar1;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_RCX;
  reference local_60;
  undefined1 local_38 [8];
  pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>_>
  edge;
  lock_guard<ipc::spinlock> lg;
  StackTrace *this_local;
  
  std::lock_guard<ipc::spinlock>::lock_guard
            ((lock_guard<ipc::spinlock> *)&edge.second.m_src,&this->lock);
  boost::
  out_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config,boost::bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config>>
            ((pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>_>
              *)local_38,(boost *)this->_ce,(vertex_descriptor)&this->_local_stack,in_RCX);
  boost::iterators::detail::
  iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long,_false,_false>
  ::operator*(&local_60,
              (iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long,_false,_false>
               *)local_38);
  uVar1 = boost::
          target<boost::bidirectional_tag,unsigned_long,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>
                    (&local_60.super_edge_base<boost::bidirectional_tag,_unsigned_long>,
                     &this->_local_stack);
  this->_ce = uVar1;
  std::lock_guard<ipc::spinlock>::~lock_guard((lock_guard<ipc::spinlock> *)&edge.second.m_src);
  return;
}

Assistant:

void StackTrace::pop_stack_element() {
  std::lock_guard<ipc::spinlock> lg(lock);
  auto edge = boost::out_edges(_ce, _local_stack);
  _ce = (boost::target(*(edge.first), _local_stack));

#if 0
    _pop_count++;
    if(_pop_count > 1000){ // TODO: magic value?
        _pop_count = 0;
        // clean has a huge performance impact
        clean();
    }
#endif
}